

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_avx2_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [32];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar40 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar41 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar42 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar43 [64];
  
  if ((len & 0xffffffffffffff80) == 0) {
    auVar15 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    pauVar1 = (undefined1 (*) [32])data;
  }
  else {
    auVar30._8_8_ = 0x5555555555555555;
    auVar30._0_8_ = 0x5555555555555555;
    auVar30._16_8_ = 0x5555555555555555;
    auVar30._24_8_ = 0x5555555555555555;
    auVar31._8_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar31._0_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar31._16_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar31._24_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar32._8_8_ = 0x3333333333333333;
    auVar32._0_8_ = 0x3333333333333333;
    auVar32._16_8_ = 0x3333333333333333;
    auVar32._24_8_ = 0x3333333333333333;
    auVar33._8_8_ = 0xcccccccccccccccc;
    auVar33._0_8_ = 0xcccccccccccccccc;
    auVar33._16_8_ = 0xcccccccccccccccc;
    auVar33._24_8_ = 0xcccccccccccccccc;
    auVar34[8] = 0xf;
    auVar34._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar34[9] = 0xf;
    auVar34[10] = 0xf;
    auVar34[0xb] = 0xf;
    auVar34[0xc] = 0xf;
    auVar34[0xd] = 0xf;
    auVar34[0xe] = 0xf;
    auVar34[0xf] = 0xf;
    auVar34[0x10] = 0xf;
    auVar34[0x11] = 0xf;
    auVar34[0x12] = 0xf;
    auVar34[0x13] = 0xf;
    auVar34[0x14] = 0xf;
    auVar34[0x15] = 0xf;
    auVar34[0x16] = 0xf;
    auVar34[0x17] = 0xf;
    auVar34[0x18] = 0xf;
    auVar34[0x19] = 0xf;
    auVar34[0x1a] = 0xf;
    auVar34[0x1b] = 0xf;
    auVar34[0x1c] = 0xf;
    auVar34[0x1d] = 0xf;
    auVar34[0x1e] = 0xf;
    auVar34[0x1f] = 0xf;
    auVar35._16_16_ = _DAT_0011f1c0;
    auVar35._0_16_ = _DAT_0011f1c0;
    pauVar1 = (undefined1 (*) [32])(data + (len & 0xffffffffffffff80));
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    do {
      iVar3 = 0x3f;
      auVar7 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar43 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar42 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar41 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar40 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
      auVar39 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar38 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar37 = ZEXT1664(auVar7);
      auVar36 = ZEXT1664((undefined1  [16])0x0);
      pauVar5 = (undefined1 (*) [32])data;
      while( true ) {
        data = (uint8_t *)(pauVar5 + 4);
        auVar8 = vmovdqu64_avx512vl(pauVar5[1]);
        auVar9 = vmovdqu64_avx512vl(*pauVar5);
        auVar10 = vmovdqu64_avx512vl(pauVar5[3]);
        auVar11 = vmovdqu64_avx512vl(pauVar5[2]);
        iVar3 = iVar3 + -1;
        auVar12 = vpaddb_avx512vl(auVar8,auVar8);
        auVar8 = vpsrld_avx512vl(auVar8,1);
        auVar12 = vpternlogq_avx512vl(auVar12,auVar31,auVar9,0xe2);
        auVar8 = vpternlogq_avx512vl(auVar8,auVar30,auVar9,0xe2);
        auVar9 = vpaddb_avx512vl(auVar10,auVar10);
        auVar10 = vpsrld_avx512vl(auVar10,1);
        auVar9 = vpternlogq_avx512vl(auVar9,auVar31,auVar11,0xe2);
        auVar10 = vpternlogq_avx512vl(auVar10,auVar30,auVar11,0xe2);
        auVar11 = vpslld_avx512vl(auVar9,2);
        auVar13 = vpslld_avx512vl(auVar10,2);
        auVar10 = vpsrld_avx512vl(auVar10,2);
        auVar9 = vpsrld_avx512vl(auVar9,2);
        auVar11 = vpternlogq_avx512vl(auVar11,auVar33,auVar12,0xe2);
        auVar13 = vpternlogq_avx512vl(auVar13,auVar33,auVar8,0xe2);
        auVar8 = vpternlogq_avx512vl(auVar10,auVar32,auVar8,0xe2);
        auVar9 = vpternlogq_avx512vl(auVar9,auVar32,auVar12,0xe2);
        auVar10 = vpandq_avx512vl(auVar11,auVar34);
        auVar10 = vpshufb_avx512vl(auVar35,auVar10);
        auVar10 = vpaddb_avx512vl(auVar10,auVar43._0_32_);
        auVar43 = ZEXT3264(auVar10);
        auVar11 = vpsrld_avx512vl(auVar11,4);
        auVar11 = vpandq_avx512vl(auVar11,auVar34);
        auVar11 = vpshufb_avx512vl(auVar35,auVar11);
        auVar11 = vpaddb_avx512vl(auVar11,auVar39._0_32_);
        auVar39 = ZEXT3264(auVar11);
        auVar12 = vpandq_avx512vl(auVar13,auVar34);
        auVar12 = vpshufb_avx512vl(auVar35,auVar12);
        auVar12 = vpaddb_avx512vl(auVar12,auVar42._0_32_);
        auVar42 = ZEXT3264(auVar12);
        auVar13 = vpsrld_avx512vl(auVar13,4);
        auVar13 = vpandq_avx512vl(auVar13,auVar34);
        auVar13 = vpshufb_avx512vl(auVar35,auVar13);
        auVar13 = vpaddb_avx512vl(auVar13,auVar38._0_32_);
        auVar38 = ZEXT3264(auVar13);
        auVar14 = vpandq_avx512vl(auVar9,auVar34);
        auVar9 = vpsrld_avx512vl(auVar9,4);
        auVar9 = vpandq_avx512vl(auVar9,auVar34);
        auVar14 = vpshufb_avx512vl(auVar35,auVar14);
        auVar9 = vpshufb_avx512vl(auVar35,auVar9);
        auVar14 = vpaddb_avx512vl(auVar14,auVar41._0_32_);
        auVar41 = ZEXT3264(auVar14);
        auVar15 = vpaddb_avx512vl(auVar9,auVar37._0_32_);
        auVar37 = ZEXT3264(auVar15);
        auVar9 = vpandq_avx512vl(auVar8,auVar34);
        auVar9 = vpshufb_avx512vl(auVar35,auVar9);
        auVar16 = vpaddb_avx512vl(auVar9,auVar40._0_32_);
        auVar40 = ZEXT3264(auVar16);
        auVar8 = vpsrld_avx512vl(auVar8,4);
        auVar8 = vpandq_avx512vl(auVar8,auVar34);
        auVar8 = vpshufb_avx512vl(auVar35,auVar8);
        auVar17 = vpaddb_avx512vl(auVar8,auVar36._0_32_);
        auVar36 = ZEXT3264(auVar17);
        if (iVar3 == 0) break;
        pauVar6 = pauVar5 + 4;
        pauVar5 = (undefined1 (*) [32])data;
        if (pauVar6 == pauVar1) {
          auVar30 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar8 = vpsadbw_avx512vl(auVar12,auVar30);
          auVar9 = vpsadbw_avx512vl(auVar14,auVar30);
          auVar10 = vpsadbw_avx512vl(auVar10,auVar30);
          auVar8 = vpaddq_avx2(auVar8,auVar27._0_32_);
          auVar9 = vpaddq_avx2(auVar9,auVar26._0_32_);
          auVar12 = vpsadbw_avx512vl(auVar16,auVar30);
          auVar14 = vpsadbw_avx512vl(auVar11,auVar30);
          auVar10 = vpaddq_avx2(auVar10,auVar28._0_32_);
          auVar11 = vpaddq_avx2(auVar12,auVar25._0_32_);
          auVar12 = vpaddq_avx2(auVar14,auVar24._0_32_);
          auVar13 = vpsadbw_avx512vl(auVar13,auVar30);
          auVar14 = vpsadbw_avx512vl(auVar15,auVar30);
          auVar15 = vpsadbw_avx2(auVar17,auVar30);
          auVar13 = vpaddq_avx2(auVar13,auVar23._0_32_);
          auVar14 = vpaddq_avx2(auVar14,auVar22._0_32_);
          auVar15 = vpaddq_avx2(auVar15,auVar21._0_32_);
          goto LAB_00114731;
        }
      }
      auVar29 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar8 = vpsadbw_avx512vl(auVar10,auVar29);
      in_ZMM22 = ZEXT3264(auVar8);
      auVar9 = vpsadbw_avx512vl(auVar12,auVar29);
      in_ZMM21 = ZEXT3264(auVar9);
      auVar12 = vpsadbw_avx512vl(auVar14,auVar29);
      in_ZMM20 = ZEXT3264(auVar12);
      auVar14 = vpsadbw_avx512vl(auVar16,auVar29);
      in_ZMM19 = ZEXT3264(auVar14);
      auVar16 = vpsadbw_avx512vl(auVar11,auVar29);
      in_ZMM18 = ZEXT3264(auVar16);
      auVar13 = vpsadbw_avx512vl(auVar13,auVar29);
      in_ZMM17 = ZEXT3264(auVar13);
      auVar18 = vpsadbw_avx512vl(auVar15,auVar29);
      in_ZMM16 = ZEXT3264(auVar18);
      auVar15 = vpsadbw_avx2(auVar17,auVar29);
      auVar10 = vpaddq_avx512vl(auVar8,auVar28._0_32_);
      auVar28 = ZEXT3264(auVar10);
      auVar8 = vpaddq_avx512vl(auVar9,auVar27._0_32_);
      auVar27 = ZEXT3264(auVar8);
      auVar9 = vpaddq_avx512vl(auVar12,auVar26._0_32_);
      auVar26 = ZEXT3264(auVar9);
      auVar11 = vpaddq_avx512vl(auVar14,auVar25._0_32_);
      auVar25 = ZEXT3264(auVar11);
      auVar12 = vpaddq_avx512vl(auVar16,auVar24._0_32_);
      auVar24 = ZEXT3264(auVar12);
      auVar13 = vpaddq_avx512vl(auVar13,auVar23._0_32_);
      auVar23 = ZEXT3264(auVar13);
      auVar14 = vpaddq_avx512vl(auVar18,auVar22._0_32_);
      auVar22 = ZEXT3264(auVar14);
      auVar15 = vpaddq_avx2(auVar15,auVar21._0_32_);
      auVar21 = ZEXT3264(auVar15);
    } while ((undefined1 (*) [32])data != pauVar1);
  }
LAB_00114731:
  auVar7 = vpunpcklqdq_avx(auVar10._0_16_,auVar8._0_16_);
  uVar19 = auVar11._0_8_;
  auVar18._8_8_ = uVar19;
  auVar18._0_8_ = uVar19;
  auVar18._16_8_ = uVar19;
  auVar18._24_8_ = uVar19;
  auVar31 = vpermq_avx2(auVar9,0x55);
  auVar17._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar7;
  auVar17._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9._0_16_;
  auVar30 = vpblendd_avx2(auVar17,auVar18,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar10._0_16_,auVar8._0_16_);
  auVar31 = vpblendd_avx2(ZEXT1632(auVar7),auVar31,0xf0);
  auVar20 = auVar15._0_16_;
  auVar29._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar20;
  auVar29._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar11._0_16_;
  auVar32 = vpblendd_avx2(auVar31,auVar29,0xc0);
  auVar31 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar30 = vpaddq_avx2(auVar30,auVar32);
  auVar33 = vpunpcklqdq_avx2(auVar10,auVar8);
  auVar32 = vpunpckhqdq_avx2(auVar10,auVar8);
  auVar8 = vperm2i128_avx2(auVar33,auVar9,0x31);
  auVar8 = vpermt2q_avx512vl(auVar8,auVar31,auVar11);
  auVar8 = vpaddq_avx2(auVar30,auVar8);
  auVar10 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar9 = vpermt2q_avx512vl(auVar32,auVar10,auVar9);
  uVar19 = auVar15._0_8_;
  auVar16._8_8_ = uVar19;
  auVar16._0_8_ = uVar19;
  auVar16._16_8_ = uVar19;
  auVar16._24_8_ = uVar19;
  auVar9 = vpblendd_avx2(auVar9,auVar11,0xc0);
  auVar11 = vpermq_avx2(auVar14,0x55);
  auVar8 = vpaddq_avx2(auVar8,auVar9);
  auVar7 = vpmovqd_avx512vl(auVar8);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar7;
  auVar7 = vpunpcklqdq_avx(auVar12._0_16_,auVar13._0_16_);
  auVar8._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar7;
  auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14._0_16_;
  auVar8 = vpblendd_avx2(auVar8,auVar16,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar12._0_16_,auVar13._0_16_);
  auVar9 = vpblendd_avx2(ZEXT1632(auVar7),auVar11,0xf0);
  auVar11._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar20;
  auVar11._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar20;
  auVar9 = vpblendd_avx2(auVar9,auVar11,0xc0);
  auVar8 = vpaddq_avx2(auVar8,auVar9);
  auVar11 = vpunpcklqdq_avx2(auVar12,auVar13);
  auVar9 = vpunpckhqdq_avx2(auVar12,auVar13);
  auVar11 = vperm2i128_avx2(auVar11,auVar14,0x31);
  auVar9 = vpermt2q_avx512vl(auVar9,auVar10,auVar14);
  auVar10 = vpermt2q_avx512vl(auVar11,auVar31,auVar15);
  auVar9 = vpblendd_avx2(auVar9,auVar15,0xc0);
  auVar8 = vpaddq_avx2(auVar8,auVar10);
  auVar8 = vpaddq_avx2(auVar8,auVar9);
  auVar7 = vpmovqd_avx512vl(auVar8);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar7;
  if ((len & 0x7f) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] + (uint)(((byte)(*pauVar1)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0)
        ;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0x7f));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx2_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    const __m256i popcnt_4bit = _mm256_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4,

        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m256i lo_nibble = _mm256_set1_epi8(0x0f);

    int local = 0;
    __m256i counter8bit_a = zero;
    __m256i counter8bit_b = zero;
    __m256i counter8bit_c = zero;
    __m256i counter8bit_d = zero;
    __m256i counter8bit_e = zero;
    __m256i counter8bit_f = zero;
    __m256i counter8bit_g = zero;
    __m256i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*32 - 1)]; data != end; data += 4*32) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m256i s0 = avx2_merge1_even(r0, r1);
        const __m256i s1 = avx2_merge1_odd (r0, r1);
        const __m256i s2 = avx2_merge1_even(r2, r3);
        const __m256i s3 = avx2_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m256i d0 = avx2_merge2_even(s0, s2);
        const __m256i d1 = avx2_merge2_even(s1, s3);
        const __m256i d2 = avx2_merge2_odd (s0, s2);
        const __m256i d3 = avx2_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i popcnt_a = _mm256_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m256i popcnt_e = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d0, 4) & lo_nibble);
        const __m256i popcnt_b = _mm256_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m256i popcnt_f = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d1, 4) & lo_nibble);
        const __m256i popcnt_c = _mm256_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m256i popcnt_g = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d2, 4) & lo_nibble);
        const __m256i popcnt_d = _mm256_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m256i popcnt_h = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm256_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm256_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm256_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm256_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm256_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm256_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm256_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm256_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm256_setzero_si256();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_b);
    flag_counts[2] += avx2_sum_epu64(counter_c);
    flag_counts[3] += avx2_sum_epu64(counter_d);
    flag_counts[4] += avx2_sum_epu64(counter_e);
    flag_counts[5] += avx2_sum_epu64(counter_f);
    flag_counts[6] += avx2_sum_epu64(counter_g);
    flag_counts[7] += avx2_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*32), flag_counts);
}